

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O3

long __thiscall mkvparser::SegmentInfo::Parse(SegmentInfo *this)

{
  double *result;
  IMkvReader *pReader;
  longlong lVar1;
  longlong lVar2;
  long lVar3;
  longlong lVar4;
  char **str;
  long stop;
  longlong pos;
  longlong size;
  longlong id;
  longlong local_60;
  longlong local_58;
  char **local_50;
  char **local_48;
  char **local_40;
  long local_38;
  
  pReader = this->m_pSegment->m_pReader;
  local_60 = this->m_start;
  stop = this->m_size + local_60;
  this->m_timecodeScale = 1000000;
  result = &this->m_duration;
  this->m_duration = -1.0;
  local_40 = &this->m_pTitleAsUTF8;
  local_48 = &this->m_pWritingAppAsUTF8;
  local_50 = &this->m_pMuxingAppAsUTF8;
  do {
    if (stop <= local_60) {
      if ((double)this->m_timecodeScale * this->m_duration <= 9.223372036854776e+18) {
        return (ulong)(local_60 == stop) * 2 + -2;
      }
      return -2;
    }
    lVar3 = ParseElementHeader(pReader,&local_60,stop,&local_38,&local_58);
    lVar2 = local_58;
    lVar1 = local_60;
    if (lVar3 < 0) {
      return lVar3;
    }
    if (local_38 < 0x5741) {
      if (local_38 == 0x4489) {
        lVar3 = UnserializeFloat(pReader,local_60,local_58,result);
        if (lVar3 < 0) {
          return lVar3;
        }
        if (*result <= 0.0 && *result != 0.0) {
          return -2;
        }
      }
      else {
        str = local_50;
        if (local_38 == 0x4d80) goto LAB_001568fe;
      }
    }
    else {
      str = local_48;
      if ((local_38 == 0x5741) || (str = local_40, local_38 == 0x7ba9)) {
LAB_001568fe:
        lVar3 = UnserializeString(pReader,local_60,local_58,str);
        if (lVar3 != 0) {
          return lVar3;
        }
      }
      else if (local_38 == 0x2ad7b1) {
        lVar4 = UnserializeUInt(pReader,local_60,local_58);
        this->m_timecodeScale = lVar4;
        if (lVar4 < 1) {
          return -2;
        }
      }
    }
    local_60 = lVar1 + lVar2;
    if (stop < local_60) {
      return -2;
    }
  } while( true );
}

Assistant:

long SegmentInfo::Parse() {
  assert(m_pMuxingAppAsUTF8 == NULL);
  assert(m_pWritingAppAsUTF8 == NULL);
  assert(m_pTitleAsUTF8 == NULL);

  IMkvReader* const pReader = m_pSegment->m_pReader;

  long long pos = m_start;
  const long long stop = m_start + m_size;

  m_timecodeScale = 1000000;
  m_duration = -1;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvTimecodeScale) {
      m_timecodeScale = UnserializeUInt(pReader, pos, size);

      if (m_timecodeScale <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDuration) {
      const long status = UnserializeFloat(pReader, pos, size, m_duration);

      if (status < 0)
        return status;

      if (m_duration < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvMuxingApp) {
      const long status =
          UnserializeString(pReader, pos, size, m_pMuxingAppAsUTF8);

      if (status)
        return status;
    } else if (id == libwebm::kMkvWritingApp) {
      const long status =
          UnserializeString(pReader, pos, size, m_pWritingAppAsUTF8);

      if (status)
        return status;
    } else if (id == libwebm::kMkvTitle) {
      const long status = UnserializeString(pReader, pos, size, m_pTitleAsUTF8);

      if (status)
        return status;
    }

    pos += size;

    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  const double rollover_check = m_duration * m_timecodeScale;
  if (rollover_check > static_cast<double>(LLONG_MAX))
    return E_FILE_FORMAT_INVALID;

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  return 0;
}